

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::getDSAPublicKey(SoftHSM *this,DSAPublicKey *publicKey,Token *token,OSObject *key)

{
  Token *pTVar1;
  int iVar2;
  undefined1 in_CL;
  undefined1 uVar3;
  byte bVar4;
  undefined7 in_register_00000009;
  Token *in_RDX;
  long *in_RSI;
  uchar *in_R8;
  size_t in_R9;
  bool bOK;
  ByteString value;
  ByteString generator;
  ByteString subprime;
  ByteString prime;
  bool isKeyPrivate;
  ByteString *in_stack_fffffffffffffd68;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  byte local_27a;
  byte local_26a;
  byte local_25a;
  undefined1 local_248 [40];
  undefined1 local_220 [40];
  undefined1 local_1f8 [40];
  undefined1 local_1d0 [40];
  undefined4 local_1a8;
  byte local_1a1;
  EVP_PKEY_CTX local_1a0 [47];
  byte local_171;
  EVP_PKEY_CTX local_170 [47];
  byte local_141;
  EVP_PKEY_CTX local_140 [47];
  byte local_111;
  EVP_PKEY_CTX local_110 [47];
  byte local_e1;
  uchar local_e0 [40];
  uchar local_b8 [56];
  uchar local_80 [40];
  uchar local_58 [47];
  byte local_29;
  long *local_28;
  Token *local_20;
  long *local_18;
  CK_RV local_8;
  
  local_28 = (long *)CONCAT71(in_register_00000009,in_CL);
  if (in_RSI == (long *)0x0) {
    return 7;
  }
  if (in_RDX == (Token *)0x0) {
    return 7;
  }
  if (local_28 == (long *)0x0) {
    return 7;
  }
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_29 = (**(code **)(*local_28 + 0x20))(local_28,2,0);
  ByteString::ByteString((ByteString *)0x172917);
  ByteString::ByteString((ByteString *)0x172924);
  ByteString::ByteString((ByteString *)0x172933);
  ByteString::ByteString((ByteString *)0x172942);
  pTVar1 = local_20;
  if ((local_29 & 1) == 0) {
    (**(code **)(*local_28 + 0x30))(local_1d0,local_28,0x130);
    ByteString::operator=
              ((ByteString *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    ByteString::~ByteString((ByteString *)0x172d75);
    (**(code **)(*local_28 + 0x30))(local_1f8,local_28,0x131);
    ByteString::operator=
              ((ByteString *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    ByteString::~ByteString((ByteString *)0x172db9);
    (**(code **)(*local_28 + 0x30))(local_220,local_28,0x132);
    ByteString::operator=
              ((ByteString *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    ByteString::~ByteString((ByteString *)0x172df4);
    (**(code **)(*local_28 + 0x30))(local_248,local_28,0x11);
    ByteString::operator=
              ((ByteString *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    ByteString::~ByteString((ByteString *)0x172e2f);
  }
  else {
    local_e1 = 1;
    uVar3 = 1;
    local_111 = 0;
    (**(code **)(*local_28 + 0x30))(local_110,local_28,0x130);
    local_111 = 1;
    iVar2 = Token::decrypt(pTVar1,local_110,local_58,(size_t *)CONCAT71(in_register_00000009,uVar3),
                           in_R8,in_R9);
    local_e1 = (byte)iVar2 & 1;
    if ((local_111 & 1) != 0) {
      ByteString::~ByteString((ByteString *)0x1729f9);
    }
    pTVar1 = local_20;
    local_141 = 0;
    local_25a = 0;
    if ((local_e1 & 1) != 0) {
      bVar4 = local_e1;
      (**(code **)(*local_28 + 0x30))(local_140,local_28,0x131);
      local_141 = 1;
      iVar2 = Token::decrypt(pTVar1,local_140,local_80,
                             (size_t *)CONCAT71(in_register_00000009,bVar4),in_R8,in_R9);
      local_25a = (byte)iVar2;
    }
    local_e1 = local_25a & 1;
    if ((local_141 & 1) != 0) {
      ByteString::~ByteString((ByteString *)0x172a98);
    }
    pTVar1 = local_20;
    local_171 = 0;
    local_26a = 0;
    if ((local_e1 & 1) != 0) {
      bVar4 = local_e1;
      (**(code **)(*local_28 + 0x30))(local_170,local_28,0x132);
      local_171 = 1;
      iVar2 = Token::decrypt(pTVar1,local_170,local_b8,
                             (size_t *)CONCAT71(in_register_00000009,bVar4),in_R8,in_R9);
      local_26a = (byte)iVar2;
    }
    local_e1 = local_26a & 1;
    if ((local_171 & 1) != 0) {
      ByteString::~ByteString((ByteString *)0x172b37);
    }
    local_1a1 = 0;
    local_27a = 0;
    if ((local_e1 & 1) != 0) {
      bVar4 = local_e1;
      (**(code **)(*local_28 + 0x30))(local_1a0,local_28,0x11);
      local_1a1 = 1;
      iVar2 = Token::decrypt(local_20,local_1a0,local_e0,
                             (size_t *)CONCAT71(in_register_00000009,bVar4),in_R8,in_R9);
      local_27a = (byte)iVar2;
    }
    local_e1 = local_27a & 1;
    if ((local_1a1 & 1) != 0) {
      ByteString::~ByteString((ByteString *)0x172bd6);
    }
    if ((local_e1 & 1) == 0) {
      local_8 = 5;
      goto LAB_00172f49;
    }
  }
  (**(code **)(*local_18 + 0x30))(local_18,local_58);
  (**(code **)(*local_18 + 0x38))(local_18,local_80);
  (**(code **)(*local_18 + 0x40))(local_18,local_b8);
  (**(code **)(*local_18 + 0x48))(local_18,local_e0);
  local_8 = 0;
LAB_00172f49:
  local_1a8 = 1;
  ByteString::~ByteString((ByteString *)0x172f56);
  ByteString::~ByteString((ByteString *)0x172f63);
  ByteString::~ByteString((ByteString *)0x172f70);
  ByteString::~ByteString((ByteString *)0x172f7d);
  return local_8;
}

Assistant:

CK_RV SoftHSM::getDSAPublicKey(DSAPublicKey* publicKey, Token* token, OSObject* key)
{
	if (publicKey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	// DSA Public Key Attributes
	ByteString prime;
	ByteString subprime;
	ByteString generator;
	ByteString value;
	if (isKeyPrivate)
	{
		bool bOK = true;
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PRIME), prime);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_SUBPRIME), subprime);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_BASE), generator);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_VALUE), value);
		if (!bOK)
			return CKR_GENERAL_ERROR;
	}
	else
	{
		prime = key->getByteStringValue(CKA_PRIME);
		subprime = key->getByteStringValue(CKA_SUBPRIME);
		generator = key->getByteStringValue(CKA_BASE);
		value = key->getByteStringValue(CKA_VALUE);
	}

	publicKey->setP(prime);
	publicKey->setQ(subprime);
	publicKey->setG(generator);
	publicKey->setY(value);

	return CKR_OK;
}